

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileLexer.c
# Opt level: O0

int cmListFileLexer_SetFileName(cmListFileLexer *lexer,char *name,cmListFileLexer_BOM *bom)

{
  cmListFileLexer_BOM cVar1;
  FILE *pFVar2;
  int local_24;
  int result;
  cmListFileLexer_BOM *bom_local;
  char *name_local;
  cmListFileLexer *lexer_local;
  
  local_24 = 1;
  cmListFileLexerDestroy(lexer);
  if (name != (char *)0x0) {
    pFVar2 = fopen(name,"rb");
    lexer->file = (FILE *)pFVar2;
    if (lexer->file == (FILE *)0x0) {
      local_24 = 0;
    }
    else if (bom != (cmListFileLexer_BOM *)0x0) {
      cVar1 = cmListFileLexer_ReadBOM(lexer->file);
      *bom = cVar1;
    }
  }
  cmListFileLexerInit(lexer);
  return local_24;
}

Assistant:

int cmListFileLexer_SetFileName(cmListFileLexer* lexer, const char* name,
                                cmListFileLexer_BOM* bom)
{
  int result = 1;
  cmListFileLexerDestroy(lexer);
  if (name) {
#ifdef _WIN32
    wchar_t* wname = cmsysEncoding_DupToWide(name);
    lexer->file = _wfopen(wname, L"rb");
    free(wname);
#else
    lexer->file = fopen(name, "rb");
#endif
    if (lexer->file) {
      if (bom) {
        *bom = cmListFileLexer_ReadBOM(lexer->file);
      }
    } else {
      result = 0;
    }
  }
  cmListFileLexerInit(lexer);
  return result;
}